

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

FunctionInfo *
Js::JavascriptOperators::GetConstructorFunctionInfo(Var instance,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  JavascriptFunction *pJVar5;
  int32 hCode;
  Type TVar6;
  
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ac34cc;
    *puVar4 = 0;
  }
  if (((ulong)instance & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ac34cc;
    *puVar4 = 0;
  }
  TVar6 = TypeIds_FirstNumberType;
  if ((((ulong)instance & 0xffff000000000000) != 0x1000000000000) &&
     (TVar6 = TypeIds_Number, (ulong)instance >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ac34cc;
      *puVar4 = 0;
    }
    TVar6 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar6) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00ac34cc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  if ((int)TVar6 < 0x1a) {
    if (TVar6 == TypeIds_HostDispatch) {
      return (FunctionInfo *)0x0;
    }
    if (TVar6 == TypeIds_Null) {
      hCode = -0x7ff5ec71;
      goto LAB_00ac34e8;
    }
  }
  else {
    if (TVar6 == TypeIds_Proxy) {
      return (FunctionInfo *)0x0;
    }
    if (TVar6 == TypeIds_Function) {
      pJVar5 = UnsafeVarTo<Js::JavascriptFunction>(instance);
      return (pJVar5->functionInfo).ptr;
    }
  }
  hCode = -0x7ff5fe43;
LAB_00ac34e8:
  JavascriptError::ThrowTypeError(scriptContext,hCode,(PCWSTR)0x0);
}

Assistant:

FunctionInfo* JavascriptOperators::GetConstructorFunctionInfo(Var instance, ScriptContext * scriptContext)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(instance);
        if (typeId == TypeIds_Function)
        {
            JavascriptFunction * function =  UnsafeVarTo<JavascriptFunction>(instance);
            return function->GetFunctionInfo();
        }
        if (typeId != TypeIds_HostDispatch && typeId != TypeIds_Proxy)
        {
            if (typeId == TypeIds_Null)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
            }

            JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
        }
        return nullptr;
    }